

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB_STL_utils.cpp
# Opt level: O3

void __thiscall
amrex::STLtools::read_binary_stl_file
          (STLtools *this,string *fname,Real scale,Array<Real,_3> *center,int reverse_normal)

{
  ostringstream *this_00;
  ostringstream *this_01;
  pointer pTVar1;
  Real RVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  uint32_t numtris;
  RealDescriptor real32_descr;
  IntDescriptor uint32_descr;
  IntDescriptor uint16_descr;
  char tmp [81];
  ifstream is;
  uint local_484;
  Real local_480;
  RealDescriptor local_478;
  IntDescriptor local_448;
  IntDescriptor local_438;
  undefined1 local_428 [24];
  undefined8 auStack_410 [47];
  undefined1 local_298 [12];
  undefined1 local_28c [68];
  undefined1 local_248;
  Print local_238;
  
  if (*(int *)(ParallelContext::frames + 0xc) == 0) {
    local_480 = scale;
    iVar3 = Verbose();
    if (iVar3 != 0) {
      local_238.os = OutStream();
      local_238.rank = *(int *)(DAT_0071a620 + -0x30);
      this_01 = &local_238.ss;
      local_238.comm = *(MPI_Comm *)(DAT_0071a620 + -0x48);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)this_01);
      *(undefined8 *)(&local_238.field_0x18 + *(long *)(local_238._16_8_ + -0x18)) =
           *(undefined8 *)(local_238.os + *(long *)(*(long *)local_238.os + -0x18) + 8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_01,"Reading binary STL file ",0x18);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_01,(fname->_M_dataplus)._M_p,fname->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"\n",1);
      Print::~Print(&local_238);
    }
    IntDescriptor::IntDescriptor(&local_448,4,ReverseOrder);
    IntDescriptor::IntDescriptor(&local_438,2,ReverseOrder);
    RealDescriptor::RealDescriptor
              (&local_478,(Long *)FPC::ieee_float,(int *)FPC::reverse_float_order,4);
    std::ifstream::ifstream(&local_238,(string *)fname,_S_in|_S_bin);
    if (*(int *)(&local_238.field_0x20 + *(long *)(CONCAT44(local_238.comm,local_238.rank) + -0x18))
        != 0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_428,
                     "STLtools::read_binary_stl_file: failed to open ",fname);
      Abort((string *)local_428);
      if ((undefined1 *)local_428._0_8_ != local_428 + 0x10) {
        operator_delete((void *)local_428._0_8_,local_428._16_8_ + 1);
      }
    }
    local_248 = 0;
    std::istream::read((char *)&local_238,(long)local_298);
    readIntData<unsigned_int,unsigned_int>(&local_484,1,(istream *)&local_238,&local_448);
    this->m_num_tri = local_484;
    PODVector<amrex::STLtools::Triangle,_std::allocator<amrex::STLtools::Triangle>_>::resize
              (&this->m_tri_pts_h,(long)(int)local_484);
    iVar3 = Verbose();
    if (iVar3 != 0) {
      local_428._8_8_ = OutStream();
      this_00 = (ostringstream *)(local_428 + 0x10);
      local_428._4_4_ = *(undefined4 *)(DAT_0071a620 + -0x48);
      local_428._0_4_ = *(undefined4 *)(DAT_0071a620 + -0x30);
      std::__cxx11::ostringstream::ostringstream(this_00);
      *(undefined8 *)((long)auStack_410 + *(long *)(local_428._16_8_ - 0x18)) =
           *(undefined8 *)(local_428._8_8_ + *(long *)(*(long *)local_428._8_8_ + -0x18) + 8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,"    Number of triangles: ",0x19);
      std::ostream::operator<<(this_00,this->m_num_tri);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\n",1);
      Print::~Print((Print *)local_428);
    }
    if (0 < this->m_num_tri) {
      lVar5 = 0;
      lVar6 = 0;
      do {
        std::istream::read((char *)&local_238,(long)local_298);
        pTVar1 = (this->m_tri_pts_h).m_data;
        RealDescriptor::convertToNativeFormat((Real *)(pTVar1 + lVar6),9,local_28c,&local_478);
        lVar4 = 0;
        do {
          *(double *)((long)&(pTVar1->v1).x + lVar4 + lVar5) =
               *(double *)((long)&(pTVar1->v1).x + lVar4 + lVar5) * local_480 + center->_M_elems[0];
          *(double *)((long)&(pTVar1->v1).y + lVar4 + lVar5) =
               *(double *)((long)&(pTVar1->v1).y + lVar4 + lVar5) * local_480 + center->_M_elems[1];
          *(double *)((long)&(pTVar1->v1).z + lVar4 + lVar5) =
               *(double *)((long)&(pTVar1->v1).z + lVar4 + lVar5) * local_480 + center->_M_elems[2];
          lVar4 = lVar4 + 0x18;
        } while ((int)lVar4 != 0x48);
        if (reverse_normal != 0) {
          pTVar1 = (this->m_tri_pts_h).m_data;
          local_428._16_8_ = pTVar1[lVar6].v1.z;
          local_428._0_8_ = pTVar1[lVar6].v1.x;
          local_428._8_8_ = pTVar1[lVar6].v1.y;
          RVar2 = pTVar1[lVar6].v2.y;
          pTVar1[lVar6].v1.x = pTVar1[lVar6].v2.x;
          pTVar1[lVar6].v1.y = RVar2;
          pTVar1[lVar6].v1.z = pTVar1[lVar6].v2.z;
          pTVar1[lVar6].v2.x = (Real)local_428._0_8_;
          pTVar1[lVar6].v2.y = (Real)local_428._8_8_;
          pTVar1[lVar6].v2.z = (Real)local_428._16_8_;
        }
        lVar6 = lVar6 + 1;
        lVar5 = lVar5 + 0x48;
      } while (lVar6 < this->m_num_tri);
    }
    std::ifstream::~ifstream(&local_238);
    if (local_478.ord.super_vector<int,_std::allocator<int>_>.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
        (pointer)0x0) {
      operator_delete(local_478.ord.super_vector<int,_std::allocator<int>_>.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start,(long)local_478.ord.super_vector<int,_std::allocator<int>_>.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage -
                               (long)local_478.ord.super_vector<int,_std::allocator<int>_>.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start);
    }
    if (local_478.fr.super_vector<long,_std::allocator<long>_>.
        super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start !=
        (pointer)0x0) {
      operator_delete(local_478.fr.super_vector<long,_std::allocator<long>_>.
                      super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_478.fr.super_vector<long,_std::allocator<long>_>.
                            super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_478.fr.super_vector<long,_std::allocator<long>_>.
                            super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void
STLtools::read_binary_stl_file (std::string const& fname, Real scale,
                                Array<Real,3> const& center, int reverse_normal)
{
    if (ParallelDescriptor::IOProcessor()) {
        if (amrex::Verbose()) {
            Print() << "Reading binary STL file "<< fname << "\n";
        }

        IntDescriptor uint32_descr(sizeof(uint32_t), IntDescriptor::ReverseOrder);
        IntDescriptor uint16_descr(sizeof(uint16_t), IntDescriptor::ReverseOrder);
        RealDescriptor real32_descr(FPC::ieee_float, FPC::reverse_float_order, 4);

        std::ifstream is(fname, std::istringstream::in|std::ios::binary);
        if (!is.good()) {
            amrex::Abort("STLtools::read_binary_stl_file: failed to open " + fname);
        }

        char tmp[81];
        tmp[80] = '\0';
        is.read(tmp, 80); // Header - 80 bytes

        uint32_t numtris; // uint32 - Number of triangles - 4 bytes
        amrex::readIntData<uint32_t,uint32_t>(&numtris, 1, is, uint32_descr);
        m_num_tri = static_cast<int>(numtris);
        m_tri_pts_h.resize(m_num_tri);

        if (amrex::Verbose()) {
            Print() << "    Number of triangles: " << m_num_tri << "\n";
        }

        for (int i=0; i < m_num_tri; ++i) {
            is.read(tmp, 50);  // 50 bytes for each triangle. Vertex 1 starts at 12 bytes.
            Real* p = &(m_tri_pts_h[i].v1.x);
            RealDescriptor::convertToNativeFormat(p, 9, tmp+12, real32_descr);
            for (int j = 0; j < 3; ++j) {
                p[0] = p[0] * scale + center[0];
                p[1] = p[1] * scale + center[1];
                p[2] = p[2] * scale + center[2];
                p += 3;
            }
            if (reverse_normal) {
                std::swap(m_tri_pts_h[i].v1, m_tri_pts_h[i].v2);
            }
        }
    }
}